

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O3

float Abc_NtkComputeNodeDeparture(Abc_Obj_t *pObj,float Slew)

{
  float *pfVar1;
  int iVar2;
  Abc_Obj_t *pNode;
  long lVar3;
  long lVar4;
  ulong uVar5;
  Abc_Ntk_t *pAVar6;
  uint uVar7;
  long lVar8;
  float fVar9;
  
  uVar7 = pObj->Id;
  uVar5 = (ulong)(int)uVar7;
  if (-1 < (long)uVar5) {
    pAVar6 = pObj->pNtk;
    lVar8 = *(long *)((long)pAVar6->pBSMan + 0x50);
    if ((int)uVar7 < *(int *)(lVar8 + 4)) {
      fVar9 = *(float *)(*(long *)(lVar8 + 8) + uVar5 * 4);
      if ((fVar9 != 0.0) || (NAN(fVar9))) {
        __assert_fail("Bus_SclObjDept(pObj) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclBufSize.c"
                      ,0xb6,"float Abc_NtkComputeNodeDeparture(Abc_Obj_t *, float)");
      }
      if (0 < (pObj->vFanouts).nSize) {
        lVar8 = 0;
        do {
          pNode = (Abc_Obj_t *)pAVar6->vObjs->pArray[(pObj->vFanouts).pArray[lVar8]];
          uVar7 = *(uint *)&pNode->field_0x14 & 0xf;
          if (uVar7 == 7 && pNode->pNtk->ntkFunc == ABC_FUNC_MAP) {
            if (((pNode->vFanins).nSize == 1) && ((pNode->field_5).pData == (void *)0x0)) {
              iVar2 = pNode->Id;
              if (((long)iVar2 < 0) ||
                 (lVar3 = *(long *)((long)pNode->pNtk->pBSMan + 0x50), *(int *)(lVar3 + 4) <= iVar2)
                 ) goto LAB_0045e35c;
              if (((int)uVar5 < 0) ||
                 (lVar4 = *(long *)((long)pAVar6->pBSMan + 0x50), *(int *)(lVar4 + 4) <= (int)uVar5)
                 ) goto LAB_0045e33d;
              fVar9 = *(float *)(*(long *)(lVar3 + 8) + (long)iVar2 * 4);
              lVar3 = *(long *)(lVar4 + 8);
              pfVar1 = (float *)(lVar3 + (uVar5 & 0xffffffff) * 4);
              if (*pfVar1 <= fVar9 && fVar9 != *pfVar1) {
                *(float *)(lVar3 + (uVar5 & 0xffffffff) * 4) = fVar9;
              }
            }
            else {
LAB_0045e2ba:
              Abc_NodeFindFanin(pNode,pObj);
              fVar9 = Abc_NtkComputeEdgeDept((Abc_Obj_t *)pNode->pNtk,pNode->Id,Slew);
              uVar5 = (ulong)pObj->Id;
              if ((long)uVar5 < 0) {
LAB_0045e33d:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                              ,0x173,"float *Vec_FltEntryP(Vec_Flt_t *, int)");
              }
              pAVar6 = pObj->pNtk;
              lVar3 = *(long *)((long)pAVar6->pBSMan + 0x50);
              if (*(int *)(lVar3 + 4) <= pObj->Id) goto LAB_0045e33d;
              lVar3 = *(long *)(lVar3 + 8);
              pfVar1 = (float *)(lVar3 + uVar5 * 4);
              if (*pfVar1 <= fVar9 && fVar9 != *pfVar1) {
                *(float *)(lVar3 + uVar5 * 4) = fVar9;
              }
            }
          }
          else if (uVar7 - 5 < 0xfffffffe) goto LAB_0045e2ba;
          uVar7 = (uint)uVar5;
          lVar8 = lVar8 + 1;
        } while (lVar8 < (pObj->vFanouts).nSize);
        if ((int)uVar7 < 0) goto LAB_0045e35c;
        lVar8 = *(long *)((long)pAVar6->pBSMan + 0x50);
      }
      if ((int)uVar7 < *(int *)(lVar8 + 4)) {
        return *(float *)(*(long *)(lVar8 + 8) + (ulong)uVar7 * 4);
      }
    }
  }
LAB_0045e35c:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
}

Assistant:

float Abc_NtkComputeNodeDeparture( Abc_Obj_t * pObj, float Slew )
{
    Abc_Obj_t * pFanout;
    int i;
    assert( Bus_SclObjDept(pObj) == 0 );
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        if ( Abc_ObjIsBarBuf(pFanout) )
            Bus_SclObjUpdateDept( pObj, Bus_SclObjDept(pFanout) );
        else if ( !Abc_ObjIsCo(pFanout) ) // add required times here
            Bus_SclObjUpdateDept( pObj, Abc_NtkComputeEdgeDept(pFanout, Abc_NodeFindFanin(pFanout, pObj), Slew) );
    }
    return Bus_SclObjDept( pObj );
}